

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall polyscope::render::Engine::buildEngineGui(Engine *this)

{
  ImVec2 IVar1;
  TransparencyMode *this_00;
  TransparencyMode TVar2;
  bool bVar3;
  int iVar4;
  value_type *__val;
  size_t sVar5;
  pointer pcVar6;
  TransparencyMode *m_00;
  TransparencyMode *extraout_RDX;
  TransparencyMode *extraout_RDX_00;
  TransparencyMode *extraout_RDX_01;
  TransparencyMode *extraout_RDX_02;
  TransparencyMode *extraout_RDX_03;
  TransparencyMode *m_01;
  pointer pcVar7;
  long lVar8;
  char *fmt;
  int *v;
  string matName;
  string mName;
  string fileext;
  TransparencyMode m;
  string matName_1;
  undefined1 *local_1f0;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  char local_1a0 [16];
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  undefined1 *local_170;
  long local_168;
  undefined1 local_160 [16];
  ImVec2 local_150;
  long local_148;
  undefined1 local_140 [16];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ImGui::SetNextItemOpen(false,4);
  bVar3 = ImGui::TreeNode("Appearance");
  if (!bVar3) {
    return;
  }
  ImGui::PushItemWidth(120.0);
  if ((buildEngineGui()::displayBackgroundName_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&buildEngineGui()::displayBackgroundName_abi_cxx11_), iVar4 != 0))
  {
    buildEngineGui()::displayBackgroundName_abi_cxx11_._M_dataplus._M_p =
         (pointer)&buildEngineGui()::displayBackgroundName_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&buildEngineGui()::displayBackgroundName_abi_cxx11_,"None","");
    __cxa_atexit(std::__cxx11::string::~string,&buildEngineGui()::displayBackgroundName_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&buildEngineGui()::displayBackgroundName_abi_cxx11_);
  }
  ImGui::ColorEdit4("background color",(float *)&view::bgColor,0x20);
  ImGui::SetNextItemOpen(false,4);
  bVar3 = ImGui::TreeNode("Transparency");
  if (!bVar3) goto LAB_001ce8b6;
  this_00 = &this->transparencyMode;
  modeName_abi_cxx11_((string *)local_1d0,(polyscope *)this_00,m_00);
  bVar3 = ImGui::BeginCombo("Mode",(char *)local_1d0._0_8_,0);
  m_01 = extraout_RDX;
  if (local_1d0._0_8_ != (long)local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
    m_01 = extraout_RDX_00;
  }
  if (bVar3) {
    local_1f0 = (undefined1 *)0x100000000;
    local_1e8 = 2;
    lVar8 = 0;
    do {
      TVar2 = *(TransparencyMode *)((long)&local_1f0 + lVar8);
      local_170 = (undefined1 *)CONCAT44(local_170._4_4_,TVar2);
      modeName_abi_cxx11_((string *)local_1d0,(polyscope *)&local_170,m_01);
      local_150.x = 0.0;
      local_150.y = 0.0;
      bVar3 = ImGui::Selectable((char *)local_1d0._0_8_,*this_00 == TVar2,0,&local_150);
      m_01 = extraout_RDX_01;
      if (bVar3) {
        options::transparencyMode = TVar2;
        requestRedraw();
        m_01 = extraout_RDX_02;
      }
      if (local_1d0._0_8_ != (long)local_1d0 + 0x10) {
        operator_delete((void *)local_1d0._0_8_);
        m_01 = extraout_RDX_03;
      }
      lVar8 = lVar8 + 4;
    } while (lVar8 != 0xc);
    ImGui::EndCombo();
  }
  TVar2 = *this_00;
  if (TVar2 == Pretty) {
    ImGui::TextWrapped(
                      "Accurate but expensive transparent rendering. Increase the number of passes to resolve complicated scenes."
                      );
    bVar3 = ImGui::InputInt("Render Passes",&options::transparencyRenderPasses,1,100,0);
    if (bVar3) {
      requestRedraw();
    }
  }
  else {
    if (TVar2 == Simple) {
      fmt = 
      "Simple transparent rendering. Efficient, but objects at different depths may not look right."
      ;
    }
    else {
      if (TVar2 != None) goto LAB_001ce8b1;
      fmt = "Transparency effects are disabled and all related options are ignored.";
    }
    ImGui::TextWrapped(fmt);
  }
LAB_001ce8b1:
  ImGui::TreePop();
LAB_001ce8b6:
  GroundPlane::buildGui(&this->groundPlane);
  ImGui::SetNextItemOpen(false,4);
  bVar3 = ImGui::TreeNode("Tone Mapping");
  if (bVar3) {
    ImGui::SliderFloat("exposure",&this->exposure,0.1,2.0,"%.3f",2.0);
    ImGui::SliderFloat("white level",&this->whiteLevel,0.0,2.0,"%.3f",2.0);
    ImGui::SliderFloat("gamma",&this->gamma,0.5,3.0,"%.3f",2.0);
    ImGui::TreePop();
  }
  ImGui::SetNextItemOpen(false,4);
  bVar3 = ImGui::TreeNode("Anti-Aliasing");
  if (bVar3) {
    v = &this->ssaaFactor;
    bVar3 = ImGui::InputInt("SSAA (pretty)",v,1,100,0);
    if (bVar3) {
      iVar4 = 4;
      if (*v < 4) {
        iVar4 = *v;
      }
      options::ssaaFactor = 1;
      if (1 < iVar4) {
        options::ssaaFactor = iVar4;
      }
      *v = options::ssaaFactor;
      requestRedraw();
    }
    ImGui::TreePop();
  }
  ImGui::SetNextItemOpen(false,4);
  bVar3 = ImGui::TreeNode("Materials");
  if (bVar3) {
    ImGui::SetNextItemOpen(false,4);
    bVar3 = ImGui::TreeNode("Load material");
    if (bVar3) {
      if ((buildEngineGui()::buffName == '\0') &&
         (iVar4 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar4 != 0)) {
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar6 = (pointer)operator_new(0x200);
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar6 + 0x200;
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar6;
        buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pcVar6[0x1c0] = '\0';
        pcVar6[0x1c1] = '\0';
        pcVar6[0x1c2] = '\0';
        pcVar6[0x1c3] = '\0';
        pcVar6[0x1c4] = '\0';
        pcVar6[0x1c5] = '\0';
        pcVar6[0x1c6] = '\0';
        pcVar6[0x1c7] = '\0';
        pcVar6[0x1c8] = '\0';
        pcVar6[0x1c9] = '\0';
        pcVar6[0x1ca] = '\0';
        pcVar6[0x1cb] = '\0';
        pcVar6[0x1cc] = '\0';
        pcVar6[0x1cd] = '\0';
        pcVar6[0x1ce] = '\0';
        pcVar6[0x1cf] = '\0';
        pcVar6[0x1d0] = '\0';
        pcVar6[0x1d1] = '\0';
        pcVar6[0x1d2] = '\0';
        pcVar6[0x1d3] = '\0';
        pcVar6[0x1d4] = '\0';
        pcVar6[0x1d5] = '\0';
        pcVar6[0x1d6] = '\0';
        pcVar6[0x1d7] = '\0';
        pcVar6[0x1d8] = '\0';
        pcVar6[0x1d9] = '\0';
        pcVar6[0x1da] = '\0';
        pcVar6[0x1db] = '\0';
        pcVar6[0x1dc] = '\0';
        pcVar6[0x1dd] = '\0';
        pcVar6[0x1de] = '\0';
        pcVar6[0x1df] = '\0';
        pcVar6[0x1e0] = '\0';
        pcVar6[0x1e1] = '\0';
        pcVar6[0x1e2] = '\0';
        pcVar6[0x1e3] = '\0';
        pcVar6[0x1e4] = '\0';
        pcVar6[0x1e5] = '\0';
        pcVar6[0x1e6] = '\0';
        pcVar6[0x1e7] = '\0';
        pcVar6[0x1e8] = '\0';
        pcVar6[0x1e9] = '\0';
        pcVar6[0x1ea] = '\0';
        pcVar6[0x1eb] = '\0';
        pcVar6[0x1ec] = '\0';
        pcVar6[0x1ed] = '\0';
        pcVar6[0x1ee] = '\0';
        pcVar6[0x1ef] = '\0';
        pcVar6[0x1f0] = '\0';
        pcVar6[0x1f1] = '\0';
        pcVar6[0x1f2] = '\0';
        pcVar6[499] = '\0';
        pcVar6[500] = '\0';
        pcVar6[0x1f5] = '\0';
        pcVar6[0x1f6] = '\0';
        pcVar6[0x1f7] = '\0';
        pcVar6[0x1f8] = '\0';
        pcVar6[0x1f9] = '\0';
        pcVar6[0x1fa] = '\0';
        pcVar6[0x1fb] = '\0';
        pcVar6[0x1fc] = '\0';
        pcVar6[0x1fd] = '\0';
        pcVar6[0x1fe] = '\0';
        pcVar6[0x1ff] = '\0';
        pcVar6[0x180] = '\0';
        pcVar6[0x181] = '\0';
        pcVar6[0x182] = '\0';
        pcVar6[0x183] = '\0';
        pcVar6[0x184] = '\0';
        pcVar6[0x185] = '\0';
        pcVar6[0x186] = '\0';
        pcVar6[0x187] = '\0';
        pcVar6[0x188] = '\0';
        pcVar6[0x189] = '\0';
        pcVar6[0x18a] = '\0';
        pcVar6[0x18b] = '\0';
        pcVar6[0x18c] = '\0';
        pcVar6[0x18d] = '\0';
        pcVar6[0x18e] = '\0';
        pcVar6[399] = '\0';
        pcVar6[400] = '\0';
        pcVar6[0x191] = '\0';
        pcVar6[0x192] = '\0';
        pcVar6[0x193] = '\0';
        pcVar6[0x194] = '\0';
        pcVar6[0x195] = '\0';
        pcVar6[0x196] = '\0';
        pcVar6[0x197] = '\0';
        pcVar6[0x198] = '\0';
        pcVar6[0x199] = '\0';
        pcVar6[0x19a] = '\0';
        pcVar6[0x19b] = '\0';
        pcVar6[0x19c] = '\0';
        pcVar6[0x19d] = '\0';
        pcVar6[0x19e] = '\0';
        pcVar6[0x19f] = '\0';
        pcVar6[0x1a0] = '\0';
        pcVar6[0x1a1] = '\0';
        pcVar6[0x1a2] = '\0';
        pcVar6[0x1a3] = '\0';
        pcVar6[0x1a4] = '\0';
        pcVar6[0x1a5] = '\0';
        pcVar6[0x1a6] = '\0';
        pcVar6[0x1a7] = '\0';
        pcVar6[0x1a8] = '\0';
        pcVar6[0x1a9] = '\0';
        pcVar6[0x1aa] = '\0';
        pcVar6[0x1ab] = '\0';
        pcVar6[0x1ac] = '\0';
        pcVar6[0x1ad] = '\0';
        pcVar6[0x1ae] = '\0';
        pcVar6[0x1af] = '\0';
        pcVar6[0x1b0] = '\0';
        pcVar6[0x1b1] = '\0';
        pcVar6[0x1b2] = '\0';
        pcVar6[0x1b3] = '\0';
        pcVar6[0x1b4] = '\0';
        pcVar6[0x1b5] = '\0';
        pcVar6[0x1b6] = '\0';
        pcVar6[0x1b7] = '\0';
        pcVar6[0x1b8] = '\0';
        pcVar6[0x1b9] = '\0';
        pcVar6[0x1ba] = '\0';
        pcVar6[0x1bb] = '\0';
        pcVar6[0x1bc] = '\0';
        pcVar6[0x1bd] = '\0';
        pcVar6[0x1be] = '\0';
        pcVar6[0x1bf] = '\0';
        pcVar6[0x140] = '\0';
        pcVar6[0x141] = '\0';
        pcVar6[0x142] = '\0';
        pcVar6[0x143] = '\0';
        pcVar6[0x144] = '\0';
        pcVar6[0x145] = '\0';
        pcVar6[0x146] = '\0';
        pcVar6[0x147] = '\0';
        pcVar6[0x148] = '\0';
        pcVar6[0x149] = '\0';
        pcVar6[0x14a] = '\0';
        pcVar6[0x14b] = '\0';
        pcVar6[0x14c] = '\0';
        pcVar6[0x14d] = '\0';
        pcVar6[0x14e] = '\0';
        pcVar6[0x14f] = '\0';
        pcVar6[0x150] = '\0';
        pcVar6[0x151] = '\0';
        pcVar6[0x152] = '\0';
        pcVar6[0x153] = '\0';
        pcVar6[0x154] = '\0';
        pcVar6[0x155] = '\0';
        pcVar6[0x156] = '\0';
        pcVar6[0x157] = '\0';
        pcVar6[0x158] = '\0';
        pcVar6[0x159] = '\0';
        pcVar6[0x15a] = '\0';
        pcVar6[0x15b] = '\0';
        pcVar6[0x15c] = '\0';
        pcVar6[0x15d] = '\0';
        pcVar6[0x15e] = '\0';
        pcVar6[0x15f] = '\0';
        pcVar6[0x160] = '\0';
        pcVar6[0x161] = '\0';
        pcVar6[0x162] = '\0';
        pcVar6[0x163] = '\0';
        pcVar6[0x164] = '\0';
        pcVar6[0x165] = '\0';
        pcVar6[0x166] = '\0';
        pcVar6[0x167] = '\0';
        pcVar6[0x168] = '\0';
        pcVar6[0x169] = '\0';
        pcVar6[0x16a] = '\0';
        pcVar6[0x16b] = '\0';
        pcVar6[0x16c] = '\0';
        pcVar6[0x16d] = '\0';
        pcVar6[0x16e] = '\0';
        pcVar6[0x16f] = '\0';
        pcVar6[0x170] = '\0';
        pcVar6[0x171] = '\0';
        pcVar6[0x172] = '\0';
        pcVar6[0x173] = '\0';
        pcVar6[0x174] = '\0';
        pcVar6[0x175] = '\0';
        pcVar6[0x176] = '\0';
        pcVar6[0x177] = '\0';
        pcVar6[0x178] = '\0';
        pcVar6[0x179] = '\0';
        pcVar6[0x17a] = '\0';
        pcVar6[0x17b] = '\0';
        pcVar6[0x17c] = '\0';
        pcVar6[0x17d] = '\0';
        pcVar6[0x17e] = '\0';
        pcVar6[0x17f] = '\0';
        pcVar6[0x100] = '\0';
        pcVar6[0x101] = '\0';
        pcVar6[0x102] = '\0';
        pcVar6[0x103] = '\0';
        pcVar6[0x104] = '\0';
        pcVar6[0x105] = '\0';
        pcVar6[0x106] = '\0';
        pcVar6[0x107] = '\0';
        pcVar6[0x108] = '\0';
        pcVar6[0x109] = '\0';
        pcVar6[0x10a] = '\0';
        pcVar6[0x10b] = '\0';
        pcVar6[0x10c] = '\0';
        pcVar6[0x10d] = '\0';
        pcVar6[0x10e] = '\0';
        pcVar6[0x10f] = '\0';
        pcVar6[0x110] = '\0';
        pcVar6[0x111] = '\0';
        pcVar6[0x112] = '\0';
        pcVar6[0x113] = '\0';
        pcVar6[0x114] = '\0';
        pcVar6[0x115] = '\0';
        pcVar6[0x116] = '\0';
        pcVar6[0x117] = '\0';
        pcVar6[0x118] = '\0';
        pcVar6[0x119] = '\0';
        pcVar6[0x11a] = '\0';
        pcVar6[0x11b] = '\0';
        pcVar6[0x11c] = '\0';
        pcVar6[0x11d] = '\0';
        pcVar6[0x11e] = '\0';
        pcVar6[0x11f] = '\0';
        pcVar6[0x120] = '\0';
        pcVar6[0x121] = '\0';
        pcVar6[0x122] = '\0';
        pcVar6[0x123] = '\0';
        pcVar6[0x124] = '\0';
        pcVar6[0x125] = '\0';
        pcVar6[0x126] = '\0';
        pcVar6[0x127] = '\0';
        pcVar6[0x128] = '\0';
        pcVar6[0x129] = '\0';
        pcVar6[0x12a] = '\0';
        pcVar6[299] = '\0';
        pcVar6[300] = '\0';
        pcVar6[0x12d] = '\0';
        pcVar6[0x12e] = '\0';
        pcVar6[0x12f] = '\0';
        pcVar6[0x130] = '\0';
        pcVar6[0x131] = '\0';
        pcVar6[0x132] = '\0';
        pcVar6[0x133] = '\0';
        pcVar6[0x134] = '\0';
        pcVar6[0x135] = '\0';
        pcVar6[0x136] = '\0';
        pcVar6[0x137] = '\0';
        pcVar6[0x138] = '\0';
        pcVar6[0x139] = '\0';
        pcVar6[0x13a] = '\0';
        pcVar6[0x13b] = '\0';
        pcVar6[0x13c] = '\0';
        pcVar6[0x13d] = '\0';
        pcVar6[0x13e] = '\0';
        pcVar6[0x13f] = '\0';
        pcVar6[0xc0] = '\0';
        pcVar6[0xc1] = '\0';
        pcVar6[0xc2] = '\0';
        pcVar6[0xc3] = '\0';
        pcVar6[0xc4] = '\0';
        pcVar6[0xc5] = '\0';
        pcVar6[0xc6] = '\0';
        pcVar6[199] = '\0';
        pcVar6[200] = '\0';
        pcVar6[0xc9] = '\0';
        pcVar6[0xca] = '\0';
        pcVar6[0xcb] = '\0';
        pcVar6[0xcc] = '\0';
        pcVar6[0xcd] = '\0';
        pcVar6[0xce] = '\0';
        pcVar6[0xcf] = '\0';
        pcVar6[0xd0] = '\0';
        pcVar6[0xd1] = '\0';
        pcVar6[0xd2] = '\0';
        pcVar6[0xd3] = '\0';
        pcVar6[0xd4] = '\0';
        pcVar6[0xd5] = '\0';
        pcVar6[0xd6] = '\0';
        pcVar6[0xd7] = '\0';
        pcVar6[0xd8] = '\0';
        pcVar6[0xd9] = '\0';
        pcVar6[0xda] = '\0';
        pcVar6[0xdb] = '\0';
        pcVar6[0xdc] = '\0';
        pcVar6[0xdd] = '\0';
        pcVar6[0xde] = '\0';
        pcVar6[0xdf] = '\0';
        pcVar6[0xe0] = '\0';
        pcVar6[0xe1] = '\0';
        pcVar6[0xe2] = '\0';
        pcVar6[0xe3] = '\0';
        pcVar6[0xe4] = '\0';
        pcVar6[0xe5] = '\0';
        pcVar6[0xe6] = '\0';
        pcVar6[0xe7] = '\0';
        pcVar6[0xe8] = '\0';
        pcVar6[0xe9] = '\0';
        pcVar6[0xea] = '\0';
        pcVar6[0xeb] = '\0';
        pcVar6[0xec] = '\0';
        pcVar6[0xed] = '\0';
        pcVar6[0xee] = '\0';
        pcVar6[0xef] = '\0';
        pcVar6[0xf0] = '\0';
        pcVar6[0xf1] = '\0';
        pcVar6[0xf2] = '\0';
        pcVar6[0xf3] = '\0';
        pcVar6[0xf4] = '\0';
        pcVar6[0xf5] = '\0';
        pcVar6[0xf6] = '\0';
        pcVar6[0xf7] = '\0';
        pcVar6[0xf8] = '\0';
        pcVar6[0xf9] = '\0';
        pcVar6[0xfa] = '\0';
        pcVar6[0xfb] = '\0';
        pcVar6[0xfc] = '\0';
        pcVar6[0xfd] = '\0';
        pcVar6[0xfe] = '\0';
        pcVar6[0xff] = '\0';
        pcVar6[0x80] = '\0';
        pcVar6[0x81] = '\0';
        pcVar6[0x82] = '\0';
        pcVar6[0x83] = '\0';
        pcVar6[0x84] = '\0';
        pcVar6[0x85] = '\0';
        pcVar6[0x86] = '\0';
        pcVar6[0x87] = '\0';
        pcVar6[0x88] = '\0';
        pcVar6[0x89] = '\0';
        pcVar6[0x8a] = '\0';
        pcVar6[0x8b] = '\0';
        pcVar6[0x8c] = '\0';
        pcVar6[0x8d] = '\0';
        pcVar6[0x8e] = '\0';
        pcVar6[0x8f] = '\0';
        pcVar6[0x90] = '\0';
        pcVar6[0x91] = '\0';
        pcVar6[0x92] = '\0';
        pcVar6[0x93] = '\0';
        pcVar6[0x94] = '\0';
        pcVar6[0x95] = '\0';
        pcVar6[0x96] = '\0';
        pcVar6[0x97] = '\0';
        pcVar6[0x98] = '\0';
        pcVar6[0x99] = '\0';
        pcVar6[0x9a] = '\0';
        pcVar6[0x9b] = '\0';
        pcVar6[0x9c] = '\0';
        pcVar6[0x9d] = '\0';
        pcVar6[0x9e] = '\0';
        pcVar6[0x9f] = '\0';
        pcVar6[0xa0] = '\0';
        pcVar6[0xa1] = '\0';
        pcVar6[0xa2] = '\0';
        pcVar6[0xa3] = '\0';
        pcVar6[0xa4] = '\0';
        pcVar6[0xa5] = '\0';
        pcVar6[0xa6] = '\0';
        pcVar6[0xa7] = '\0';
        pcVar6[0xa8] = '\0';
        pcVar6[0xa9] = '\0';
        pcVar6[0xaa] = '\0';
        pcVar6[0xab] = '\0';
        pcVar6[0xac] = '\0';
        pcVar6[0xad] = '\0';
        pcVar6[0xae] = '\0';
        pcVar6[0xaf] = '\0';
        pcVar6[0xb0] = '\0';
        pcVar6[0xb1] = '\0';
        pcVar6[0xb2] = '\0';
        pcVar6[0xb3] = '\0';
        pcVar6[0xb4] = '\0';
        pcVar6[0xb5] = '\0';
        pcVar6[0xb6] = '\0';
        pcVar6[0xb7] = '\0';
        pcVar6[0xb8] = '\0';
        pcVar6[0xb9] = '\0';
        pcVar6[0xba] = '\0';
        pcVar6[0xbb] = '\0';
        pcVar6[0xbc] = '\0';
        pcVar6[0xbd] = '\0';
        pcVar6[0xbe] = '\0';
        pcVar6[0xbf] = '\0';
        pcVar6[0x40] = '\0';
        pcVar6[0x41] = '\0';
        pcVar6[0x42] = '\0';
        pcVar6[0x43] = '\0';
        pcVar6[0x44] = '\0';
        pcVar6[0x45] = '\0';
        pcVar6[0x46] = '\0';
        pcVar6[0x47] = '\0';
        pcVar6[0x48] = '\0';
        pcVar6[0x49] = '\0';
        pcVar6[0x4a] = '\0';
        pcVar6[0x4b] = '\0';
        pcVar6[0x4c] = '\0';
        pcVar6[0x4d] = '\0';
        pcVar6[0x4e] = '\0';
        pcVar6[0x4f] = '\0';
        pcVar6[0x50] = '\0';
        pcVar6[0x51] = '\0';
        pcVar6[0x52] = '\0';
        pcVar6[0x53] = '\0';
        pcVar6[0x54] = '\0';
        pcVar6[0x55] = '\0';
        pcVar6[0x56] = '\0';
        pcVar6[0x57] = '\0';
        pcVar6[0x58] = '\0';
        pcVar6[0x59] = '\0';
        pcVar6[0x5a] = '\0';
        pcVar6[0x5b] = '\0';
        pcVar6[0x5c] = '\0';
        pcVar6[0x5d] = '\0';
        pcVar6[0x5e] = '\0';
        pcVar6[0x5f] = '\0';
        pcVar6[0x60] = '\0';
        pcVar6[0x61] = '\0';
        pcVar6[0x62] = '\0';
        pcVar6[99] = '\0';
        pcVar6[100] = '\0';
        pcVar6[0x65] = '\0';
        pcVar6[0x66] = '\0';
        pcVar6[0x67] = '\0';
        pcVar6[0x68] = '\0';
        pcVar6[0x69] = '\0';
        pcVar6[0x6a] = '\0';
        pcVar6[0x6b] = '\0';
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        pcVar6[0x70] = '\0';
        pcVar6[0x71] = '\0';
        pcVar6[0x72] = '\0';
        pcVar6[0x73] = '\0';
        pcVar6[0x74] = '\0';
        pcVar6[0x75] = '\0';
        pcVar6[0x76] = '\0';
        pcVar6[0x77] = '\0';
        pcVar6[0x78] = '\0';
        pcVar6[0x79] = '\0';
        pcVar6[0x7a] = '\0';
        pcVar6[0x7b] = '\0';
        pcVar6[0x7c] = '\0';
        pcVar6[0x7d] = '\0';
        pcVar6[0x7e] = '\0';
        pcVar6[0x7f] = '\0';
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        pcVar6[8] = '\0';
        pcVar6[9] = '\0';
        pcVar6[10] = '\0';
        pcVar6[0xb] = '\0';
        pcVar6[0xc] = '\0';
        pcVar6[0xd] = '\0';
        pcVar6[0xe] = '\0';
        pcVar6[0xf] = '\0';
        pcVar6[0x10] = '\0';
        pcVar6[0x11] = '\0';
        pcVar6[0x12] = '\0';
        pcVar6[0x13] = '\0';
        pcVar6[0x14] = '\0';
        pcVar6[0x15] = '\0';
        pcVar6[0x16] = '\0';
        pcVar6[0x17] = '\0';
        pcVar6[0x18] = '\0';
        pcVar6[0x19] = '\0';
        pcVar6[0x1a] = '\0';
        pcVar6[0x1b] = '\0';
        pcVar6[0x1c] = '\0';
        pcVar6[0x1d] = '\0';
        pcVar6[0x1e] = '\0';
        pcVar6[0x1f] = '\0';
        pcVar6[0x20] = '\0';
        pcVar6[0x21] = '\0';
        pcVar6[0x22] = '\0';
        pcVar6[0x23] = '\0';
        pcVar6[0x24] = '\0';
        pcVar6[0x25] = '\0';
        pcVar6[0x26] = '\0';
        pcVar6[0x27] = '\0';
        pcVar6[0x28] = '\0';
        pcVar6[0x29] = '\0';
        pcVar6[0x2a] = '\0';
        pcVar6[0x2b] = '\0';
        pcVar6[0x2c] = '\0';
        pcVar6[0x2d] = '\0';
        pcVar6[0x2e] = '\0';
        pcVar6[0x2f] = '\0';
        pcVar6[0x30] = '\0';
        pcVar6[0x31] = '\0';
        pcVar6[0x32] = '\0';
        pcVar6[0x33] = '\0';
        pcVar6[0x34] = '\0';
        pcVar6[0x35] = '\0';
        pcVar6[0x36] = '\0';
        pcVar6[0x37] = '\0';
        pcVar6[0x38] = '\0';
        pcVar6[0x39] = '\0';
        pcVar6[0x3a] = '\0';
        pcVar6[0x3b] = '\0';
        pcVar6[0x3c] = '\0';
        pcVar6[0x3d] = '\0';
        pcVar6[0x3e] = '\0';
        pcVar6[0x3f] = '\0';
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffName,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffName);
      }
      ImGui::InputText("Material name",
                       buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      if ((buildEngineGui()::buffFile == '\0') &&
         (iVar4 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar4 != 0)) {
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar6 = (pointer)operator_new(0x200);
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar6 + 0x200;
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar6;
        buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pcVar6[0x1c0] = '\0';
        pcVar6[0x1c1] = '\0';
        pcVar6[0x1c2] = '\0';
        pcVar6[0x1c3] = '\0';
        pcVar6[0x1c4] = '\0';
        pcVar6[0x1c5] = '\0';
        pcVar6[0x1c6] = '\0';
        pcVar6[0x1c7] = '\0';
        pcVar6[0x1c8] = '\0';
        pcVar6[0x1c9] = '\0';
        pcVar6[0x1ca] = '\0';
        pcVar6[0x1cb] = '\0';
        pcVar6[0x1cc] = '\0';
        pcVar6[0x1cd] = '\0';
        pcVar6[0x1ce] = '\0';
        pcVar6[0x1cf] = '\0';
        pcVar6[0x1d0] = '\0';
        pcVar6[0x1d1] = '\0';
        pcVar6[0x1d2] = '\0';
        pcVar6[0x1d3] = '\0';
        pcVar6[0x1d4] = '\0';
        pcVar6[0x1d5] = '\0';
        pcVar6[0x1d6] = '\0';
        pcVar6[0x1d7] = '\0';
        pcVar6[0x1d8] = '\0';
        pcVar6[0x1d9] = '\0';
        pcVar6[0x1da] = '\0';
        pcVar6[0x1db] = '\0';
        pcVar6[0x1dc] = '\0';
        pcVar6[0x1dd] = '\0';
        pcVar6[0x1de] = '\0';
        pcVar6[0x1df] = '\0';
        pcVar6[0x1e0] = '\0';
        pcVar6[0x1e1] = '\0';
        pcVar6[0x1e2] = '\0';
        pcVar6[0x1e3] = '\0';
        pcVar6[0x1e4] = '\0';
        pcVar6[0x1e5] = '\0';
        pcVar6[0x1e6] = '\0';
        pcVar6[0x1e7] = '\0';
        pcVar6[0x1e8] = '\0';
        pcVar6[0x1e9] = '\0';
        pcVar6[0x1ea] = '\0';
        pcVar6[0x1eb] = '\0';
        pcVar6[0x1ec] = '\0';
        pcVar6[0x1ed] = '\0';
        pcVar6[0x1ee] = '\0';
        pcVar6[0x1ef] = '\0';
        pcVar6[0x1f0] = '\0';
        pcVar6[0x1f1] = '\0';
        pcVar6[0x1f2] = '\0';
        pcVar6[499] = '\0';
        pcVar6[500] = '\0';
        pcVar6[0x1f5] = '\0';
        pcVar6[0x1f6] = '\0';
        pcVar6[0x1f7] = '\0';
        pcVar6[0x1f8] = '\0';
        pcVar6[0x1f9] = '\0';
        pcVar6[0x1fa] = '\0';
        pcVar6[0x1fb] = '\0';
        pcVar6[0x1fc] = '\0';
        pcVar6[0x1fd] = '\0';
        pcVar6[0x1fe] = '\0';
        pcVar6[0x1ff] = '\0';
        pcVar6[0x180] = '\0';
        pcVar6[0x181] = '\0';
        pcVar6[0x182] = '\0';
        pcVar6[0x183] = '\0';
        pcVar6[0x184] = '\0';
        pcVar6[0x185] = '\0';
        pcVar6[0x186] = '\0';
        pcVar6[0x187] = '\0';
        pcVar6[0x188] = '\0';
        pcVar6[0x189] = '\0';
        pcVar6[0x18a] = '\0';
        pcVar6[0x18b] = '\0';
        pcVar6[0x18c] = '\0';
        pcVar6[0x18d] = '\0';
        pcVar6[0x18e] = '\0';
        pcVar6[399] = '\0';
        pcVar6[400] = '\0';
        pcVar6[0x191] = '\0';
        pcVar6[0x192] = '\0';
        pcVar6[0x193] = '\0';
        pcVar6[0x194] = '\0';
        pcVar6[0x195] = '\0';
        pcVar6[0x196] = '\0';
        pcVar6[0x197] = '\0';
        pcVar6[0x198] = '\0';
        pcVar6[0x199] = '\0';
        pcVar6[0x19a] = '\0';
        pcVar6[0x19b] = '\0';
        pcVar6[0x19c] = '\0';
        pcVar6[0x19d] = '\0';
        pcVar6[0x19e] = '\0';
        pcVar6[0x19f] = '\0';
        pcVar6[0x1a0] = '\0';
        pcVar6[0x1a1] = '\0';
        pcVar6[0x1a2] = '\0';
        pcVar6[0x1a3] = '\0';
        pcVar6[0x1a4] = '\0';
        pcVar6[0x1a5] = '\0';
        pcVar6[0x1a6] = '\0';
        pcVar6[0x1a7] = '\0';
        pcVar6[0x1a8] = '\0';
        pcVar6[0x1a9] = '\0';
        pcVar6[0x1aa] = '\0';
        pcVar6[0x1ab] = '\0';
        pcVar6[0x1ac] = '\0';
        pcVar6[0x1ad] = '\0';
        pcVar6[0x1ae] = '\0';
        pcVar6[0x1af] = '\0';
        pcVar6[0x1b0] = '\0';
        pcVar6[0x1b1] = '\0';
        pcVar6[0x1b2] = '\0';
        pcVar6[0x1b3] = '\0';
        pcVar6[0x1b4] = '\0';
        pcVar6[0x1b5] = '\0';
        pcVar6[0x1b6] = '\0';
        pcVar6[0x1b7] = '\0';
        pcVar6[0x1b8] = '\0';
        pcVar6[0x1b9] = '\0';
        pcVar6[0x1ba] = '\0';
        pcVar6[0x1bb] = '\0';
        pcVar6[0x1bc] = '\0';
        pcVar6[0x1bd] = '\0';
        pcVar6[0x1be] = '\0';
        pcVar6[0x1bf] = '\0';
        pcVar6[0x140] = '\0';
        pcVar6[0x141] = '\0';
        pcVar6[0x142] = '\0';
        pcVar6[0x143] = '\0';
        pcVar6[0x144] = '\0';
        pcVar6[0x145] = '\0';
        pcVar6[0x146] = '\0';
        pcVar6[0x147] = '\0';
        pcVar6[0x148] = '\0';
        pcVar6[0x149] = '\0';
        pcVar6[0x14a] = '\0';
        pcVar6[0x14b] = '\0';
        pcVar6[0x14c] = '\0';
        pcVar6[0x14d] = '\0';
        pcVar6[0x14e] = '\0';
        pcVar6[0x14f] = '\0';
        pcVar6[0x150] = '\0';
        pcVar6[0x151] = '\0';
        pcVar6[0x152] = '\0';
        pcVar6[0x153] = '\0';
        pcVar6[0x154] = '\0';
        pcVar6[0x155] = '\0';
        pcVar6[0x156] = '\0';
        pcVar6[0x157] = '\0';
        pcVar6[0x158] = '\0';
        pcVar6[0x159] = '\0';
        pcVar6[0x15a] = '\0';
        pcVar6[0x15b] = '\0';
        pcVar6[0x15c] = '\0';
        pcVar6[0x15d] = '\0';
        pcVar6[0x15e] = '\0';
        pcVar6[0x15f] = '\0';
        pcVar6[0x160] = '\0';
        pcVar6[0x161] = '\0';
        pcVar6[0x162] = '\0';
        pcVar6[0x163] = '\0';
        pcVar6[0x164] = '\0';
        pcVar6[0x165] = '\0';
        pcVar6[0x166] = '\0';
        pcVar6[0x167] = '\0';
        pcVar6[0x168] = '\0';
        pcVar6[0x169] = '\0';
        pcVar6[0x16a] = '\0';
        pcVar6[0x16b] = '\0';
        pcVar6[0x16c] = '\0';
        pcVar6[0x16d] = '\0';
        pcVar6[0x16e] = '\0';
        pcVar6[0x16f] = '\0';
        pcVar6[0x170] = '\0';
        pcVar6[0x171] = '\0';
        pcVar6[0x172] = '\0';
        pcVar6[0x173] = '\0';
        pcVar6[0x174] = '\0';
        pcVar6[0x175] = '\0';
        pcVar6[0x176] = '\0';
        pcVar6[0x177] = '\0';
        pcVar6[0x178] = '\0';
        pcVar6[0x179] = '\0';
        pcVar6[0x17a] = '\0';
        pcVar6[0x17b] = '\0';
        pcVar6[0x17c] = '\0';
        pcVar6[0x17d] = '\0';
        pcVar6[0x17e] = '\0';
        pcVar6[0x17f] = '\0';
        pcVar6[0x100] = '\0';
        pcVar6[0x101] = '\0';
        pcVar6[0x102] = '\0';
        pcVar6[0x103] = '\0';
        pcVar6[0x104] = '\0';
        pcVar6[0x105] = '\0';
        pcVar6[0x106] = '\0';
        pcVar6[0x107] = '\0';
        pcVar6[0x108] = '\0';
        pcVar6[0x109] = '\0';
        pcVar6[0x10a] = '\0';
        pcVar6[0x10b] = '\0';
        pcVar6[0x10c] = '\0';
        pcVar6[0x10d] = '\0';
        pcVar6[0x10e] = '\0';
        pcVar6[0x10f] = '\0';
        pcVar6[0x110] = '\0';
        pcVar6[0x111] = '\0';
        pcVar6[0x112] = '\0';
        pcVar6[0x113] = '\0';
        pcVar6[0x114] = '\0';
        pcVar6[0x115] = '\0';
        pcVar6[0x116] = '\0';
        pcVar6[0x117] = '\0';
        pcVar6[0x118] = '\0';
        pcVar6[0x119] = '\0';
        pcVar6[0x11a] = '\0';
        pcVar6[0x11b] = '\0';
        pcVar6[0x11c] = '\0';
        pcVar6[0x11d] = '\0';
        pcVar6[0x11e] = '\0';
        pcVar6[0x11f] = '\0';
        pcVar6[0x120] = '\0';
        pcVar6[0x121] = '\0';
        pcVar6[0x122] = '\0';
        pcVar6[0x123] = '\0';
        pcVar6[0x124] = '\0';
        pcVar6[0x125] = '\0';
        pcVar6[0x126] = '\0';
        pcVar6[0x127] = '\0';
        pcVar6[0x128] = '\0';
        pcVar6[0x129] = '\0';
        pcVar6[0x12a] = '\0';
        pcVar6[299] = '\0';
        pcVar6[300] = '\0';
        pcVar6[0x12d] = '\0';
        pcVar6[0x12e] = '\0';
        pcVar6[0x12f] = '\0';
        pcVar6[0x130] = '\0';
        pcVar6[0x131] = '\0';
        pcVar6[0x132] = '\0';
        pcVar6[0x133] = '\0';
        pcVar6[0x134] = '\0';
        pcVar6[0x135] = '\0';
        pcVar6[0x136] = '\0';
        pcVar6[0x137] = '\0';
        pcVar6[0x138] = '\0';
        pcVar6[0x139] = '\0';
        pcVar6[0x13a] = '\0';
        pcVar6[0x13b] = '\0';
        pcVar6[0x13c] = '\0';
        pcVar6[0x13d] = '\0';
        pcVar6[0x13e] = '\0';
        pcVar6[0x13f] = '\0';
        pcVar6[0xc0] = '\0';
        pcVar6[0xc1] = '\0';
        pcVar6[0xc2] = '\0';
        pcVar6[0xc3] = '\0';
        pcVar6[0xc4] = '\0';
        pcVar6[0xc5] = '\0';
        pcVar6[0xc6] = '\0';
        pcVar6[199] = '\0';
        pcVar6[200] = '\0';
        pcVar6[0xc9] = '\0';
        pcVar6[0xca] = '\0';
        pcVar6[0xcb] = '\0';
        pcVar6[0xcc] = '\0';
        pcVar6[0xcd] = '\0';
        pcVar6[0xce] = '\0';
        pcVar6[0xcf] = '\0';
        pcVar6[0xd0] = '\0';
        pcVar6[0xd1] = '\0';
        pcVar6[0xd2] = '\0';
        pcVar6[0xd3] = '\0';
        pcVar6[0xd4] = '\0';
        pcVar6[0xd5] = '\0';
        pcVar6[0xd6] = '\0';
        pcVar6[0xd7] = '\0';
        pcVar6[0xd8] = '\0';
        pcVar6[0xd9] = '\0';
        pcVar6[0xda] = '\0';
        pcVar6[0xdb] = '\0';
        pcVar6[0xdc] = '\0';
        pcVar6[0xdd] = '\0';
        pcVar6[0xde] = '\0';
        pcVar6[0xdf] = '\0';
        pcVar6[0xe0] = '\0';
        pcVar6[0xe1] = '\0';
        pcVar6[0xe2] = '\0';
        pcVar6[0xe3] = '\0';
        pcVar6[0xe4] = '\0';
        pcVar6[0xe5] = '\0';
        pcVar6[0xe6] = '\0';
        pcVar6[0xe7] = '\0';
        pcVar6[0xe8] = '\0';
        pcVar6[0xe9] = '\0';
        pcVar6[0xea] = '\0';
        pcVar6[0xeb] = '\0';
        pcVar6[0xec] = '\0';
        pcVar6[0xed] = '\0';
        pcVar6[0xee] = '\0';
        pcVar6[0xef] = '\0';
        pcVar6[0xf0] = '\0';
        pcVar6[0xf1] = '\0';
        pcVar6[0xf2] = '\0';
        pcVar6[0xf3] = '\0';
        pcVar6[0xf4] = '\0';
        pcVar6[0xf5] = '\0';
        pcVar6[0xf6] = '\0';
        pcVar6[0xf7] = '\0';
        pcVar6[0xf8] = '\0';
        pcVar6[0xf9] = '\0';
        pcVar6[0xfa] = '\0';
        pcVar6[0xfb] = '\0';
        pcVar6[0xfc] = '\0';
        pcVar6[0xfd] = '\0';
        pcVar6[0xfe] = '\0';
        pcVar6[0xff] = '\0';
        pcVar6[0x80] = '\0';
        pcVar6[0x81] = '\0';
        pcVar6[0x82] = '\0';
        pcVar6[0x83] = '\0';
        pcVar6[0x84] = '\0';
        pcVar6[0x85] = '\0';
        pcVar6[0x86] = '\0';
        pcVar6[0x87] = '\0';
        pcVar6[0x88] = '\0';
        pcVar6[0x89] = '\0';
        pcVar6[0x8a] = '\0';
        pcVar6[0x8b] = '\0';
        pcVar6[0x8c] = '\0';
        pcVar6[0x8d] = '\0';
        pcVar6[0x8e] = '\0';
        pcVar6[0x8f] = '\0';
        pcVar6[0x90] = '\0';
        pcVar6[0x91] = '\0';
        pcVar6[0x92] = '\0';
        pcVar6[0x93] = '\0';
        pcVar6[0x94] = '\0';
        pcVar6[0x95] = '\0';
        pcVar6[0x96] = '\0';
        pcVar6[0x97] = '\0';
        pcVar6[0x98] = '\0';
        pcVar6[0x99] = '\0';
        pcVar6[0x9a] = '\0';
        pcVar6[0x9b] = '\0';
        pcVar6[0x9c] = '\0';
        pcVar6[0x9d] = '\0';
        pcVar6[0x9e] = '\0';
        pcVar6[0x9f] = '\0';
        pcVar6[0xa0] = '\0';
        pcVar6[0xa1] = '\0';
        pcVar6[0xa2] = '\0';
        pcVar6[0xa3] = '\0';
        pcVar6[0xa4] = '\0';
        pcVar6[0xa5] = '\0';
        pcVar6[0xa6] = '\0';
        pcVar6[0xa7] = '\0';
        pcVar6[0xa8] = '\0';
        pcVar6[0xa9] = '\0';
        pcVar6[0xaa] = '\0';
        pcVar6[0xab] = '\0';
        pcVar6[0xac] = '\0';
        pcVar6[0xad] = '\0';
        pcVar6[0xae] = '\0';
        pcVar6[0xaf] = '\0';
        pcVar6[0xb0] = '\0';
        pcVar6[0xb1] = '\0';
        pcVar6[0xb2] = '\0';
        pcVar6[0xb3] = '\0';
        pcVar6[0xb4] = '\0';
        pcVar6[0xb5] = '\0';
        pcVar6[0xb6] = '\0';
        pcVar6[0xb7] = '\0';
        pcVar6[0xb8] = '\0';
        pcVar6[0xb9] = '\0';
        pcVar6[0xba] = '\0';
        pcVar6[0xbb] = '\0';
        pcVar6[0xbc] = '\0';
        pcVar6[0xbd] = '\0';
        pcVar6[0xbe] = '\0';
        pcVar6[0xbf] = '\0';
        pcVar6[0x40] = '\0';
        pcVar6[0x41] = '\0';
        pcVar6[0x42] = '\0';
        pcVar6[0x43] = '\0';
        pcVar6[0x44] = '\0';
        pcVar6[0x45] = '\0';
        pcVar6[0x46] = '\0';
        pcVar6[0x47] = '\0';
        pcVar6[0x48] = '\0';
        pcVar6[0x49] = '\0';
        pcVar6[0x4a] = '\0';
        pcVar6[0x4b] = '\0';
        pcVar6[0x4c] = '\0';
        pcVar6[0x4d] = '\0';
        pcVar6[0x4e] = '\0';
        pcVar6[0x4f] = '\0';
        pcVar6[0x50] = '\0';
        pcVar6[0x51] = '\0';
        pcVar6[0x52] = '\0';
        pcVar6[0x53] = '\0';
        pcVar6[0x54] = '\0';
        pcVar6[0x55] = '\0';
        pcVar6[0x56] = '\0';
        pcVar6[0x57] = '\0';
        pcVar6[0x58] = '\0';
        pcVar6[0x59] = '\0';
        pcVar6[0x5a] = '\0';
        pcVar6[0x5b] = '\0';
        pcVar6[0x5c] = '\0';
        pcVar6[0x5d] = '\0';
        pcVar6[0x5e] = '\0';
        pcVar6[0x5f] = '\0';
        pcVar6[0x60] = '\0';
        pcVar6[0x61] = '\0';
        pcVar6[0x62] = '\0';
        pcVar6[99] = '\0';
        pcVar6[100] = '\0';
        pcVar6[0x65] = '\0';
        pcVar6[0x66] = '\0';
        pcVar6[0x67] = '\0';
        pcVar6[0x68] = '\0';
        pcVar6[0x69] = '\0';
        pcVar6[0x6a] = '\0';
        pcVar6[0x6b] = '\0';
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        pcVar6[0x70] = '\0';
        pcVar6[0x71] = '\0';
        pcVar6[0x72] = '\0';
        pcVar6[0x73] = '\0';
        pcVar6[0x74] = '\0';
        pcVar6[0x75] = '\0';
        pcVar6[0x76] = '\0';
        pcVar6[0x77] = '\0';
        pcVar6[0x78] = '\0';
        pcVar6[0x79] = '\0';
        pcVar6[0x7a] = '\0';
        pcVar6[0x7b] = '\0';
        pcVar6[0x7c] = '\0';
        pcVar6[0x7d] = '\0';
        pcVar6[0x7e] = '\0';
        pcVar6[0x7f] = '\0';
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        pcVar6[8] = '\0';
        pcVar6[9] = '\0';
        pcVar6[10] = '\0';
        pcVar6[0xb] = '\0';
        pcVar6[0xc] = '\0';
        pcVar6[0xd] = '\0';
        pcVar6[0xe] = '\0';
        pcVar6[0xf] = '\0';
        pcVar6[0x10] = '\0';
        pcVar6[0x11] = '\0';
        pcVar6[0x12] = '\0';
        pcVar6[0x13] = '\0';
        pcVar6[0x14] = '\0';
        pcVar6[0x15] = '\0';
        pcVar6[0x16] = '\0';
        pcVar6[0x17] = '\0';
        pcVar6[0x18] = '\0';
        pcVar6[0x19] = '\0';
        pcVar6[0x1a] = '\0';
        pcVar6[0x1b] = '\0';
        pcVar6[0x1c] = '\0';
        pcVar6[0x1d] = '\0';
        pcVar6[0x1e] = '\0';
        pcVar6[0x1f] = '\0';
        pcVar6[0x20] = '\0';
        pcVar6[0x21] = '\0';
        pcVar6[0x22] = '\0';
        pcVar6[0x23] = '\0';
        pcVar6[0x24] = '\0';
        pcVar6[0x25] = '\0';
        pcVar6[0x26] = '\0';
        pcVar6[0x27] = '\0';
        pcVar6[0x28] = '\0';
        pcVar6[0x29] = '\0';
        pcVar6[0x2a] = '\0';
        pcVar6[0x2b] = '\0';
        pcVar6[0x2c] = '\0';
        pcVar6[0x2d] = '\0';
        pcVar6[0x2e] = '\0';
        pcVar6[0x2f] = '\0';
        pcVar6[0x30] = '\0';
        pcVar6[0x31] = '\0';
        pcVar6[0x32] = '\0';
        pcVar6[0x33] = '\0';
        pcVar6[0x34] = '\0';
        pcVar6[0x35] = '\0';
        pcVar6[0x36] = '\0';
        pcVar6[0x37] = '\0';
        pcVar6[0x38] = '\0';
        pcVar6[0x39] = '\0';
        pcVar6[0x3a] = '\0';
        pcVar6[0x3b] = '\0';
        pcVar6[0x3c] = '\0';
        pcVar6[0x3d] = '\0';
        pcVar6[0x3e] = '\0';
        pcVar6[0x3f] = '\0';
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui::buffFile,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffFile);
      }
      ImGui::InputText("File name",
                       buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      local_1d0._0_4_ = 0.0;
      local_1d0._4_4_ = 0.0;
      bVar3 = ImGui::Button("Load static material",(ImVec2 *)local_1d0);
      pcVar6 = buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar3) {
        IVar1 = (ImVec2)((long)local_1d0 + 0x10);
        local_1d0._0_8_ = IVar1;
        if (buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,pcVar6,pcVar7);
        pcVar6 = buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1f0 = local_1e0;
        if (buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,pcVar6,pcVar7);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_1f0,local_1f0 + CONCAT44(uStack_1e4,local_1e8));
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_1d0._0_8_,(pointer)(local_1d0._8_8_ + local_1d0._0_8_))
        ;
        polyscope::loadStaticMaterial(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        if ((ImVec2)local_1d0._0_8_ != IVar1) {
          operator_delete((void *)local_1d0._0_8_);
        }
      }
      local_1d0._0_4_ = 0.0;
      local_1d0._4_4_ = 0.0;
      bVar3 = ImGui::Button("Load blendable material",(ImVec2 *)local_1d0);
      pcVar6 = buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar3) {
        local_1f0 = local_1e0;
        if (buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,pcVar6,pcVar7);
        pcVar6 = buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_150 = (ImVec2)local_140;
        if (buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui::buffName.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,pcVar6,pcVar7);
        local_168 = 0;
        local_160[0] = 0;
        local_190 = local_180;
        local_188 = 0;
        local_180[0] = 0;
        local_170 = local_160;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_1f0,local_1f0 + CONCAT44(uStack_1e4,local_1e8));
        splitExt((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_1d0,&local_90);
        std::__cxx11::string::operator=((string *)&local_170,(string *)&local_1b0);
        std::__cxx11::string::operator=((string *)&local_190,(string *)local_1d0);
        if (local_1b0._M_p != local_1a0) {
          operator_delete(local_1b0._M_p);
        }
        if (local_1d0._0_8_ != (long)local_1d0 + 0x10) {
          operator_delete((void *)local_1d0._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_150,(undefined1 *)(local_148 + (long)local_150));
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_170,local_170 + local_168);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_190,local_190 + local_188);
        polyscope::loadBlendableMaterial(&local_b0,&local_d0,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (local_190 != local_180) {
          operator_delete(local_190);
        }
        if (local_170 != local_160) {
          operator_delete(local_170);
        }
        if (local_150 != (ImVec2)local_140) {
          operator_delete((void *)local_150);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  bVar3 = ImGui::TreeNode("Color Maps");
  if (bVar3) {
    ImGui::SetNextItemOpen(false,4);
    bVar3 = ImGui::TreeNode("Load color map");
    if (bVar3) {
      if ((buildEngineGui()::buffName == '\0') &&
         (iVar4 = __cxa_guard_acquire(&buildEngineGui()::buffName), iVar4 != 0)) {
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar6 = (pointer)operator_new(0x200);
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar6 + 0x200;
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar6;
        buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pcVar6[0x1c0] = '\0';
        pcVar6[0x1c1] = '\0';
        pcVar6[0x1c2] = '\0';
        pcVar6[0x1c3] = '\0';
        pcVar6[0x1c4] = '\0';
        pcVar6[0x1c5] = '\0';
        pcVar6[0x1c6] = '\0';
        pcVar6[0x1c7] = '\0';
        pcVar6[0x1c8] = '\0';
        pcVar6[0x1c9] = '\0';
        pcVar6[0x1ca] = '\0';
        pcVar6[0x1cb] = '\0';
        pcVar6[0x1cc] = '\0';
        pcVar6[0x1cd] = '\0';
        pcVar6[0x1ce] = '\0';
        pcVar6[0x1cf] = '\0';
        pcVar6[0x1d0] = '\0';
        pcVar6[0x1d1] = '\0';
        pcVar6[0x1d2] = '\0';
        pcVar6[0x1d3] = '\0';
        pcVar6[0x1d4] = '\0';
        pcVar6[0x1d5] = '\0';
        pcVar6[0x1d6] = '\0';
        pcVar6[0x1d7] = '\0';
        pcVar6[0x1d8] = '\0';
        pcVar6[0x1d9] = '\0';
        pcVar6[0x1da] = '\0';
        pcVar6[0x1db] = '\0';
        pcVar6[0x1dc] = '\0';
        pcVar6[0x1dd] = '\0';
        pcVar6[0x1de] = '\0';
        pcVar6[0x1df] = '\0';
        pcVar6[0x1e0] = '\0';
        pcVar6[0x1e1] = '\0';
        pcVar6[0x1e2] = '\0';
        pcVar6[0x1e3] = '\0';
        pcVar6[0x1e4] = '\0';
        pcVar6[0x1e5] = '\0';
        pcVar6[0x1e6] = '\0';
        pcVar6[0x1e7] = '\0';
        pcVar6[0x1e8] = '\0';
        pcVar6[0x1e9] = '\0';
        pcVar6[0x1ea] = '\0';
        pcVar6[0x1eb] = '\0';
        pcVar6[0x1ec] = '\0';
        pcVar6[0x1ed] = '\0';
        pcVar6[0x1ee] = '\0';
        pcVar6[0x1ef] = '\0';
        pcVar6[0x1f0] = '\0';
        pcVar6[0x1f1] = '\0';
        pcVar6[0x1f2] = '\0';
        pcVar6[499] = '\0';
        pcVar6[500] = '\0';
        pcVar6[0x1f5] = '\0';
        pcVar6[0x1f6] = '\0';
        pcVar6[0x1f7] = '\0';
        pcVar6[0x1f8] = '\0';
        pcVar6[0x1f9] = '\0';
        pcVar6[0x1fa] = '\0';
        pcVar6[0x1fb] = '\0';
        pcVar6[0x1fc] = '\0';
        pcVar6[0x1fd] = '\0';
        pcVar6[0x1fe] = '\0';
        pcVar6[0x1ff] = '\0';
        pcVar6[0x180] = '\0';
        pcVar6[0x181] = '\0';
        pcVar6[0x182] = '\0';
        pcVar6[0x183] = '\0';
        pcVar6[0x184] = '\0';
        pcVar6[0x185] = '\0';
        pcVar6[0x186] = '\0';
        pcVar6[0x187] = '\0';
        pcVar6[0x188] = '\0';
        pcVar6[0x189] = '\0';
        pcVar6[0x18a] = '\0';
        pcVar6[0x18b] = '\0';
        pcVar6[0x18c] = '\0';
        pcVar6[0x18d] = '\0';
        pcVar6[0x18e] = '\0';
        pcVar6[399] = '\0';
        pcVar6[400] = '\0';
        pcVar6[0x191] = '\0';
        pcVar6[0x192] = '\0';
        pcVar6[0x193] = '\0';
        pcVar6[0x194] = '\0';
        pcVar6[0x195] = '\0';
        pcVar6[0x196] = '\0';
        pcVar6[0x197] = '\0';
        pcVar6[0x198] = '\0';
        pcVar6[0x199] = '\0';
        pcVar6[0x19a] = '\0';
        pcVar6[0x19b] = '\0';
        pcVar6[0x19c] = '\0';
        pcVar6[0x19d] = '\0';
        pcVar6[0x19e] = '\0';
        pcVar6[0x19f] = '\0';
        pcVar6[0x1a0] = '\0';
        pcVar6[0x1a1] = '\0';
        pcVar6[0x1a2] = '\0';
        pcVar6[0x1a3] = '\0';
        pcVar6[0x1a4] = '\0';
        pcVar6[0x1a5] = '\0';
        pcVar6[0x1a6] = '\0';
        pcVar6[0x1a7] = '\0';
        pcVar6[0x1a8] = '\0';
        pcVar6[0x1a9] = '\0';
        pcVar6[0x1aa] = '\0';
        pcVar6[0x1ab] = '\0';
        pcVar6[0x1ac] = '\0';
        pcVar6[0x1ad] = '\0';
        pcVar6[0x1ae] = '\0';
        pcVar6[0x1af] = '\0';
        pcVar6[0x1b0] = '\0';
        pcVar6[0x1b1] = '\0';
        pcVar6[0x1b2] = '\0';
        pcVar6[0x1b3] = '\0';
        pcVar6[0x1b4] = '\0';
        pcVar6[0x1b5] = '\0';
        pcVar6[0x1b6] = '\0';
        pcVar6[0x1b7] = '\0';
        pcVar6[0x1b8] = '\0';
        pcVar6[0x1b9] = '\0';
        pcVar6[0x1ba] = '\0';
        pcVar6[0x1bb] = '\0';
        pcVar6[0x1bc] = '\0';
        pcVar6[0x1bd] = '\0';
        pcVar6[0x1be] = '\0';
        pcVar6[0x1bf] = '\0';
        pcVar6[0x140] = '\0';
        pcVar6[0x141] = '\0';
        pcVar6[0x142] = '\0';
        pcVar6[0x143] = '\0';
        pcVar6[0x144] = '\0';
        pcVar6[0x145] = '\0';
        pcVar6[0x146] = '\0';
        pcVar6[0x147] = '\0';
        pcVar6[0x148] = '\0';
        pcVar6[0x149] = '\0';
        pcVar6[0x14a] = '\0';
        pcVar6[0x14b] = '\0';
        pcVar6[0x14c] = '\0';
        pcVar6[0x14d] = '\0';
        pcVar6[0x14e] = '\0';
        pcVar6[0x14f] = '\0';
        pcVar6[0x150] = '\0';
        pcVar6[0x151] = '\0';
        pcVar6[0x152] = '\0';
        pcVar6[0x153] = '\0';
        pcVar6[0x154] = '\0';
        pcVar6[0x155] = '\0';
        pcVar6[0x156] = '\0';
        pcVar6[0x157] = '\0';
        pcVar6[0x158] = '\0';
        pcVar6[0x159] = '\0';
        pcVar6[0x15a] = '\0';
        pcVar6[0x15b] = '\0';
        pcVar6[0x15c] = '\0';
        pcVar6[0x15d] = '\0';
        pcVar6[0x15e] = '\0';
        pcVar6[0x15f] = '\0';
        pcVar6[0x160] = '\0';
        pcVar6[0x161] = '\0';
        pcVar6[0x162] = '\0';
        pcVar6[0x163] = '\0';
        pcVar6[0x164] = '\0';
        pcVar6[0x165] = '\0';
        pcVar6[0x166] = '\0';
        pcVar6[0x167] = '\0';
        pcVar6[0x168] = '\0';
        pcVar6[0x169] = '\0';
        pcVar6[0x16a] = '\0';
        pcVar6[0x16b] = '\0';
        pcVar6[0x16c] = '\0';
        pcVar6[0x16d] = '\0';
        pcVar6[0x16e] = '\0';
        pcVar6[0x16f] = '\0';
        pcVar6[0x170] = '\0';
        pcVar6[0x171] = '\0';
        pcVar6[0x172] = '\0';
        pcVar6[0x173] = '\0';
        pcVar6[0x174] = '\0';
        pcVar6[0x175] = '\0';
        pcVar6[0x176] = '\0';
        pcVar6[0x177] = '\0';
        pcVar6[0x178] = '\0';
        pcVar6[0x179] = '\0';
        pcVar6[0x17a] = '\0';
        pcVar6[0x17b] = '\0';
        pcVar6[0x17c] = '\0';
        pcVar6[0x17d] = '\0';
        pcVar6[0x17e] = '\0';
        pcVar6[0x17f] = '\0';
        pcVar6[0x100] = '\0';
        pcVar6[0x101] = '\0';
        pcVar6[0x102] = '\0';
        pcVar6[0x103] = '\0';
        pcVar6[0x104] = '\0';
        pcVar6[0x105] = '\0';
        pcVar6[0x106] = '\0';
        pcVar6[0x107] = '\0';
        pcVar6[0x108] = '\0';
        pcVar6[0x109] = '\0';
        pcVar6[0x10a] = '\0';
        pcVar6[0x10b] = '\0';
        pcVar6[0x10c] = '\0';
        pcVar6[0x10d] = '\0';
        pcVar6[0x10e] = '\0';
        pcVar6[0x10f] = '\0';
        pcVar6[0x110] = '\0';
        pcVar6[0x111] = '\0';
        pcVar6[0x112] = '\0';
        pcVar6[0x113] = '\0';
        pcVar6[0x114] = '\0';
        pcVar6[0x115] = '\0';
        pcVar6[0x116] = '\0';
        pcVar6[0x117] = '\0';
        pcVar6[0x118] = '\0';
        pcVar6[0x119] = '\0';
        pcVar6[0x11a] = '\0';
        pcVar6[0x11b] = '\0';
        pcVar6[0x11c] = '\0';
        pcVar6[0x11d] = '\0';
        pcVar6[0x11e] = '\0';
        pcVar6[0x11f] = '\0';
        pcVar6[0x120] = '\0';
        pcVar6[0x121] = '\0';
        pcVar6[0x122] = '\0';
        pcVar6[0x123] = '\0';
        pcVar6[0x124] = '\0';
        pcVar6[0x125] = '\0';
        pcVar6[0x126] = '\0';
        pcVar6[0x127] = '\0';
        pcVar6[0x128] = '\0';
        pcVar6[0x129] = '\0';
        pcVar6[0x12a] = '\0';
        pcVar6[299] = '\0';
        pcVar6[300] = '\0';
        pcVar6[0x12d] = '\0';
        pcVar6[0x12e] = '\0';
        pcVar6[0x12f] = '\0';
        pcVar6[0x130] = '\0';
        pcVar6[0x131] = '\0';
        pcVar6[0x132] = '\0';
        pcVar6[0x133] = '\0';
        pcVar6[0x134] = '\0';
        pcVar6[0x135] = '\0';
        pcVar6[0x136] = '\0';
        pcVar6[0x137] = '\0';
        pcVar6[0x138] = '\0';
        pcVar6[0x139] = '\0';
        pcVar6[0x13a] = '\0';
        pcVar6[0x13b] = '\0';
        pcVar6[0x13c] = '\0';
        pcVar6[0x13d] = '\0';
        pcVar6[0x13e] = '\0';
        pcVar6[0x13f] = '\0';
        pcVar6[0xc0] = '\0';
        pcVar6[0xc1] = '\0';
        pcVar6[0xc2] = '\0';
        pcVar6[0xc3] = '\0';
        pcVar6[0xc4] = '\0';
        pcVar6[0xc5] = '\0';
        pcVar6[0xc6] = '\0';
        pcVar6[199] = '\0';
        pcVar6[200] = '\0';
        pcVar6[0xc9] = '\0';
        pcVar6[0xca] = '\0';
        pcVar6[0xcb] = '\0';
        pcVar6[0xcc] = '\0';
        pcVar6[0xcd] = '\0';
        pcVar6[0xce] = '\0';
        pcVar6[0xcf] = '\0';
        pcVar6[0xd0] = '\0';
        pcVar6[0xd1] = '\0';
        pcVar6[0xd2] = '\0';
        pcVar6[0xd3] = '\0';
        pcVar6[0xd4] = '\0';
        pcVar6[0xd5] = '\0';
        pcVar6[0xd6] = '\0';
        pcVar6[0xd7] = '\0';
        pcVar6[0xd8] = '\0';
        pcVar6[0xd9] = '\0';
        pcVar6[0xda] = '\0';
        pcVar6[0xdb] = '\0';
        pcVar6[0xdc] = '\0';
        pcVar6[0xdd] = '\0';
        pcVar6[0xde] = '\0';
        pcVar6[0xdf] = '\0';
        pcVar6[0xe0] = '\0';
        pcVar6[0xe1] = '\0';
        pcVar6[0xe2] = '\0';
        pcVar6[0xe3] = '\0';
        pcVar6[0xe4] = '\0';
        pcVar6[0xe5] = '\0';
        pcVar6[0xe6] = '\0';
        pcVar6[0xe7] = '\0';
        pcVar6[0xe8] = '\0';
        pcVar6[0xe9] = '\0';
        pcVar6[0xea] = '\0';
        pcVar6[0xeb] = '\0';
        pcVar6[0xec] = '\0';
        pcVar6[0xed] = '\0';
        pcVar6[0xee] = '\0';
        pcVar6[0xef] = '\0';
        pcVar6[0xf0] = '\0';
        pcVar6[0xf1] = '\0';
        pcVar6[0xf2] = '\0';
        pcVar6[0xf3] = '\0';
        pcVar6[0xf4] = '\0';
        pcVar6[0xf5] = '\0';
        pcVar6[0xf6] = '\0';
        pcVar6[0xf7] = '\0';
        pcVar6[0xf8] = '\0';
        pcVar6[0xf9] = '\0';
        pcVar6[0xfa] = '\0';
        pcVar6[0xfb] = '\0';
        pcVar6[0xfc] = '\0';
        pcVar6[0xfd] = '\0';
        pcVar6[0xfe] = '\0';
        pcVar6[0xff] = '\0';
        pcVar6[0x80] = '\0';
        pcVar6[0x81] = '\0';
        pcVar6[0x82] = '\0';
        pcVar6[0x83] = '\0';
        pcVar6[0x84] = '\0';
        pcVar6[0x85] = '\0';
        pcVar6[0x86] = '\0';
        pcVar6[0x87] = '\0';
        pcVar6[0x88] = '\0';
        pcVar6[0x89] = '\0';
        pcVar6[0x8a] = '\0';
        pcVar6[0x8b] = '\0';
        pcVar6[0x8c] = '\0';
        pcVar6[0x8d] = '\0';
        pcVar6[0x8e] = '\0';
        pcVar6[0x8f] = '\0';
        pcVar6[0x90] = '\0';
        pcVar6[0x91] = '\0';
        pcVar6[0x92] = '\0';
        pcVar6[0x93] = '\0';
        pcVar6[0x94] = '\0';
        pcVar6[0x95] = '\0';
        pcVar6[0x96] = '\0';
        pcVar6[0x97] = '\0';
        pcVar6[0x98] = '\0';
        pcVar6[0x99] = '\0';
        pcVar6[0x9a] = '\0';
        pcVar6[0x9b] = '\0';
        pcVar6[0x9c] = '\0';
        pcVar6[0x9d] = '\0';
        pcVar6[0x9e] = '\0';
        pcVar6[0x9f] = '\0';
        pcVar6[0xa0] = '\0';
        pcVar6[0xa1] = '\0';
        pcVar6[0xa2] = '\0';
        pcVar6[0xa3] = '\0';
        pcVar6[0xa4] = '\0';
        pcVar6[0xa5] = '\0';
        pcVar6[0xa6] = '\0';
        pcVar6[0xa7] = '\0';
        pcVar6[0xa8] = '\0';
        pcVar6[0xa9] = '\0';
        pcVar6[0xaa] = '\0';
        pcVar6[0xab] = '\0';
        pcVar6[0xac] = '\0';
        pcVar6[0xad] = '\0';
        pcVar6[0xae] = '\0';
        pcVar6[0xaf] = '\0';
        pcVar6[0xb0] = '\0';
        pcVar6[0xb1] = '\0';
        pcVar6[0xb2] = '\0';
        pcVar6[0xb3] = '\0';
        pcVar6[0xb4] = '\0';
        pcVar6[0xb5] = '\0';
        pcVar6[0xb6] = '\0';
        pcVar6[0xb7] = '\0';
        pcVar6[0xb8] = '\0';
        pcVar6[0xb9] = '\0';
        pcVar6[0xba] = '\0';
        pcVar6[0xbb] = '\0';
        pcVar6[0xbc] = '\0';
        pcVar6[0xbd] = '\0';
        pcVar6[0xbe] = '\0';
        pcVar6[0xbf] = '\0';
        pcVar6[0x40] = '\0';
        pcVar6[0x41] = '\0';
        pcVar6[0x42] = '\0';
        pcVar6[0x43] = '\0';
        pcVar6[0x44] = '\0';
        pcVar6[0x45] = '\0';
        pcVar6[0x46] = '\0';
        pcVar6[0x47] = '\0';
        pcVar6[0x48] = '\0';
        pcVar6[0x49] = '\0';
        pcVar6[0x4a] = '\0';
        pcVar6[0x4b] = '\0';
        pcVar6[0x4c] = '\0';
        pcVar6[0x4d] = '\0';
        pcVar6[0x4e] = '\0';
        pcVar6[0x4f] = '\0';
        pcVar6[0x50] = '\0';
        pcVar6[0x51] = '\0';
        pcVar6[0x52] = '\0';
        pcVar6[0x53] = '\0';
        pcVar6[0x54] = '\0';
        pcVar6[0x55] = '\0';
        pcVar6[0x56] = '\0';
        pcVar6[0x57] = '\0';
        pcVar6[0x58] = '\0';
        pcVar6[0x59] = '\0';
        pcVar6[0x5a] = '\0';
        pcVar6[0x5b] = '\0';
        pcVar6[0x5c] = '\0';
        pcVar6[0x5d] = '\0';
        pcVar6[0x5e] = '\0';
        pcVar6[0x5f] = '\0';
        pcVar6[0x60] = '\0';
        pcVar6[0x61] = '\0';
        pcVar6[0x62] = '\0';
        pcVar6[99] = '\0';
        pcVar6[100] = '\0';
        pcVar6[0x65] = '\0';
        pcVar6[0x66] = '\0';
        pcVar6[0x67] = '\0';
        pcVar6[0x68] = '\0';
        pcVar6[0x69] = '\0';
        pcVar6[0x6a] = '\0';
        pcVar6[0x6b] = '\0';
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        pcVar6[0x70] = '\0';
        pcVar6[0x71] = '\0';
        pcVar6[0x72] = '\0';
        pcVar6[0x73] = '\0';
        pcVar6[0x74] = '\0';
        pcVar6[0x75] = '\0';
        pcVar6[0x76] = '\0';
        pcVar6[0x77] = '\0';
        pcVar6[0x78] = '\0';
        pcVar6[0x79] = '\0';
        pcVar6[0x7a] = '\0';
        pcVar6[0x7b] = '\0';
        pcVar6[0x7c] = '\0';
        pcVar6[0x7d] = '\0';
        pcVar6[0x7e] = '\0';
        pcVar6[0x7f] = '\0';
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        pcVar6[8] = '\0';
        pcVar6[9] = '\0';
        pcVar6[10] = '\0';
        pcVar6[0xb] = '\0';
        pcVar6[0xc] = '\0';
        pcVar6[0xd] = '\0';
        pcVar6[0xe] = '\0';
        pcVar6[0xf] = '\0';
        pcVar6[0x10] = '\0';
        pcVar6[0x11] = '\0';
        pcVar6[0x12] = '\0';
        pcVar6[0x13] = '\0';
        pcVar6[0x14] = '\0';
        pcVar6[0x15] = '\0';
        pcVar6[0x16] = '\0';
        pcVar6[0x17] = '\0';
        pcVar6[0x18] = '\0';
        pcVar6[0x19] = '\0';
        pcVar6[0x1a] = '\0';
        pcVar6[0x1b] = '\0';
        pcVar6[0x1c] = '\0';
        pcVar6[0x1d] = '\0';
        pcVar6[0x1e] = '\0';
        pcVar6[0x1f] = '\0';
        pcVar6[0x20] = '\0';
        pcVar6[0x21] = '\0';
        pcVar6[0x22] = '\0';
        pcVar6[0x23] = '\0';
        pcVar6[0x24] = '\0';
        pcVar6[0x25] = '\0';
        pcVar6[0x26] = '\0';
        pcVar6[0x27] = '\0';
        pcVar6[0x28] = '\0';
        pcVar6[0x29] = '\0';
        pcVar6[0x2a] = '\0';
        pcVar6[0x2b] = '\0';
        pcVar6[0x2c] = '\0';
        pcVar6[0x2d] = '\0';
        pcVar6[0x2e] = '\0';
        pcVar6[0x2f] = '\0';
        pcVar6[0x30] = '\0';
        pcVar6[0x31] = '\0';
        pcVar6[0x32] = '\0';
        pcVar6[0x33] = '\0';
        pcVar6[0x34] = '\0';
        pcVar6[0x35] = '\0';
        pcVar6[0x36] = '\0';
        pcVar6[0x37] = '\0';
        pcVar6[0x38] = '\0';
        pcVar6[0x39] = '\0';
        pcVar6[0x3a] = '\0';
        pcVar6[0x3b] = '\0';
        pcVar6[0x3c] = '\0';
        pcVar6[0x3d] = '\0';
        pcVar6[0x3e] = '\0';
        pcVar6[0x3f] = '\0';
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffName,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffName);
      }
      ImGui::InputText("Color map name",
                       buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      if ((buildEngineGui()::buffFile == '\0') &&
         (iVar4 = __cxa_guard_acquire(&buildEngineGui()::buffFile), iVar4 != 0)) {
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar6 = (pointer)operator_new(0x200);
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = pcVar6 + 0x200;
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = pcVar6;
        buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pcVar6[0x1c0] = '\0';
        pcVar6[0x1c1] = '\0';
        pcVar6[0x1c2] = '\0';
        pcVar6[0x1c3] = '\0';
        pcVar6[0x1c4] = '\0';
        pcVar6[0x1c5] = '\0';
        pcVar6[0x1c6] = '\0';
        pcVar6[0x1c7] = '\0';
        pcVar6[0x1c8] = '\0';
        pcVar6[0x1c9] = '\0';
        pcVar6[0x1ca] = '\0';
        pcVar6[0x1cb] = '\0';
        pcVar6[0x1cc] = '\0';
        pcVar6[0x1cd] = '\0';
        pcVar6[0x1ce] = '\0';
        pcVar6[0x1cf] = '\0';
        pcVar6[0x1d0] = '\0';
        pcVar6[0x1d1] = '\0';
        pcVar6[0x1d2] = '\0';
        pcVar6[0x1d3] = '\0';
        pcVar6[0x1d4] = '\0';
        pcVar6[0x1d5] = '\0';
        pcVar6[0x1d6] = '\0';
        pcVar6[0x1d7] = '\0';
        pcVar6[0x1d8] = '\0';
        pcVar6[0x1d9] = '\0';
        pcVar6[0x1da] = '\0';
        pcVar6[0x1db] = '\0';
        pcVar6[0x1dc] = '\0';
        pcVar6[0x1dd] = '\0';
        pcVar6[0x1de] = '\0';
        pcVar6[0x1df] = '\0';
        pcVar6[0x1e0] = '\0';
        pcVar6[0x1e1] = '\0';
        pcVar6[0x1e2] = '\0';
        pcVar6[0x1e3] = '\0';
        pcVar6[0x1e4] = '\0';
        pcVar6[0x1e5] = '\0';
        pcVar6[0x1e6] = '\0';
        pcVar6[0x1e7] = '\0';
        pcVar6[0x1e8] = '\0';
        pcVar6[0x1e9] = '\0';
        pcVar6[0x1ea] = '\0';
        pcVar6[0x1eb] = '\0';
        pcVar6[0x1ec] = '\0';
        pcVar6[0x1ed] = '\0';
        pcVar6[0x1ee] = '\0';
        pcVar6[0x1ef] = '\0';
        pcVar6[0x1f0] = '\0';
        pcVar6[0x1f1] = '\0';
        pcVar6[0x1f2] = '\0';
        pcVar6[499] = '\0';
        pcVar6[500] = '\0';
        pcVar6[0x1f5] = '\0';
        pcVar6[0x1f6] = '\0';
        pcVar6[0x1f7] = '\0';
        pcVar6[0x1f8] = '\0';
        pcVar6[0x1f9] = '\0';
        pcVar6[0x1fa] = '\0';
        pcVar6[0x1fb] = '\0';
        pcVar6[0x1fc] = '\0';
        pcVar6[0x1fd] = '\0';
        pcVar6[0x1fe] = '\0';
        pcVar6[0x1ff] = '\0';
        pcVar6[0x180] = '\0';
        pcVar6[0x181] = '\0';
        pcVar6[0x182] = '\0';
        pcVar6[0x183] = '\0';
        pcVar6[0x184] = '\0';
        pcVar6[0x185] = '\0';
        pcVar6[0x186] = '\0';
        pcVar6[0x187] = '\0';
        pcVar6[0x188] = '\0';
        pcVar6[0x189] = '\0';
        pcVar6[0x18a] = '\0';
        pcVar6[0x18b] = '\0';
        pcVar6[0x18c] = '\0';
        pcVar6[0x18d] = '\0';
        pcVar6[0x18e] = '\0';
        pcVar6[399] = '\0';
        pcVar6[400] = '\0';
        pcVar6[0x191] = '\0';
        pcVar6[0x192] = '\0';
        pcVar6[0x193] = '\0';
        pcVar6[0x194] = '\0';
        pcVar6[0x195] = '\0';
        pcVar6[0x196] = '\0';
        pcVar6[0x197] = '\0';
        pcVar6[0x198] = '\0';
        pcVar6[0x199] = '\0';
        pcVar6[0x19a] = '\0';
        pcVar6[0x19b] = '\0';
        pcVar6[0x19c] = '\0';
        pcVar6[0x19d] = '\0';
        pcVar6[0x19e] = '\0';
        pcVar6[0x19f] = '\0';
        pcVar6[0x1a0] = '\0';
        pcVar6[0x1a1] = '\0';
        pcVar6[0x1a2] = '\0';
        pcVar6[0x1a3] = '\0';
        pcVar6[0x1a4] = '\0';
        pcVar6[0x1a5] = '\0';
        pcVar6[0x1a6] = '\0';
        pcVar6[0x1a7] = '\0';
        pcVar6[0x1a8] = '\0';
        pcVar6[0x1a9] = '\0';
        pcVar6[0x1aa] = '\0';
        pcVar6[0x1ab] = '\0';
        pcVar6[0x1ac] = '\0';
        pcVar6[0x1ad] = '\0';
        pcVar6[0x1ae] = '\0';
        pcVar6[0x1af] = '\0';
        pcVar6[0x1b0] = '\0';
        pcVar6[0x1b1] = '\0';
        pcVar6[0x1b2] = '\0';
        pcVar6[0x1b3] = '\0';
        pcVar6[0x1b4] = '\0';
        pcVar6[0x1b5] = '\0';
        pcVar6[0x1b6] = '\0';
        pcVar6[0x1b7] = '\0';
        pcVar6[0x1b8] = '\0';
        pcVar6[0x1b9] = '\0';
        pcVar6[0x1ba] = '\0';
        pcVar6[0x1bb] = '\0';
        pcVar6[0x1bc] = '\0';
        pcVar6[0x1bd] = '\0';
        pcVar6[0x1be] = '\0';
        pcVar6[0x1bf] = '\0';
        pcVar6[0x140] = '\0';
        pcVar6[0x141] = '\0';
        pcVar6[0x142] = '\0';
        pcVar6[0x143] = '\0';
        pcVar6[0x144] = '\0';
        pcVar6[0x145] = '\0';
        pcVar6[0x146] = '\0';
        pcVar6[0x147] = '\0';
        pcVar6[0x148] = '\0';
        pcVar6[0x149] = '\0';
        pcVar6[0x14a] = '\0';
        pcVar6[0x14b] = '\0';
        pcVar6[0x14c] = '\0';
        pcVar6[0x14d] = '\0';
        pcVar6[0x14e] = '\0';
        pcVar6[0x14f] = '\0';
        pcVar6[0x150] = '\0';
        pcVar6[0x151] = '\0';
        pcVar6[0x152] = '\0';
        pcVar6[0x153] = '\0';
        pcVar6[0x154] = '\0';
        pcVar6[0x155] = '\0';
        pcVar6[0x156] = '\0';
        pcVar6[0x157] = '\0';
        pcVar6[0x158] = '\0';
        pcVar6[0x159] = '\0';
        pcVar6[0x15a] = '\0';
        pcVar6[0x15b] = '\0';
        pcVar6[0x15c] = '\0';
        pcVar6[0x15d] = '\0';
        pcVar6[0x15e] = '\0';
        pcVar6[0x15f] = '\0';
        pcVar6[0x160] = '\0';
        pcVar6[0x161] = '\0';
        pcVar6[0x162] = '\0';
        pcVar6[0x163] = '\0';
        pcVar6[0x164] = '\0';
        pcVar6[0x165] = '\0';
        pcVar6[0x166] = '\0';
        pcVar6[0x167] = '\0';
        pcVar6[0x168] = '\0';
        pcVar6[0x169] = '\0';
        pcVar6[0x16a] = '\0';
        pcVar6[0x16b] = '\0';
        pcVar6[0x16c] = '\0';
        pcVar6[0x16d] = '\0';
        pcVar6[0x16e] = '\0';
        pcVar6[0x16f] = '\0';
        pcVar6[0x170] = '\0';
        pcVar6[0x171] = '\0';
        pcVar6[0x172] = '\0';
        pcVar6[0x173] = '\0';
        pcVar6[0x174] = '\0';
        pcVar6[0x175] = '\0';
        pcVar6[0x176] = '\0';
        pcVar6[0x177] = '\0';
        pcVar6[0x178] = '\0';
        pcVar6[0x179] = '\0';
        pcVar6[0x17a] = '\0';
        pcVar6[0x17b] = '\0';
        pcVar6[0x17c] = '\0';
        pcVar6[0x17d] = '\0';
        pcVar6[0x17e] = '\0';
        pcVar6[0x17f] = '\0';
        pcVar6[0x100] = '\0';
        pcVar6[0x101] = '\0';
        pcVar6[0x102] = '\0';
        pcVar6[0x103] = '\0';
        pcVar6[0x104] = '\0';
        pcVar6[0x105] = '\0';
        pcVar6[0x106] = '\0';
        pcVar6[0x107] = '\0';
        pcVar6[0x108] = '\0';
        pcVar6[0x109] = '\0';
        pcVar6[0x10a] = '\0';
        pcVar6[0x10b] = '\0';
        pcVar6[0x10c] = '\0';
        pcVar6[0x10d] = '\0';
        pcVar6[0x10e] = '\0';
        pcVar6[0x10f] = '\0';
        pcVar6[0x110] = '\0';
        pcVar6[0x111] = '\0';
        pcVar6[0x112] = '\0';
        pcVar6[0x113] = '\0';
        pcVar6[0x114] = '\0';
        pcVar6[0x115] = '\0';
        pcVar6[0x116] = '\0';
        pcVar6[0x117] = '\0';
        pcVar6[0x118] = '\0';
        pcVar6[0x119] = '\0';
        pcVar6[0x11a] = '\0';
        pcVar6[0x11b] = '\0';
        pcVar6[0x11c] = '\0';
        pcVar6[0x11d] = '\0';
        pcVar6[0x11e] = '\0';
        pcVar6[0x11f] = '\0';
        pcVar6[0x120] = '\0';
        pcVar6[0x121] = '\0';
        pcVar6[0x122] = '\0';
        pcVar6[0x123] = '\0';
        pcVar6[0x124] = '\0';
        pcVar6[0x125] = '\0';
        pcVar6[0x126] = '\0';
        pcVar6[0x127] = '\0';
        pcVar6[0x128] = '\0';
        pcVar6[0x129] = '\0';
        pcVar6[0x12a] = '\0';
        pcVar6[299] = '\0';
        pcVar6[300] = '\0';
        pcVar6[0x12d] = '\0';
        pcVar6[0x12e] = '\0';
        pcVar6[0x12f] = '\0';
        pcVar6[0x130] = '\0';
        pcVar6[0x131] = '\0';
        pcVar6[0x132] = '\0';
        pcVar6[0x133] = '\0';
        pcVar6[0x134] = '\0';
        pcVar6[0x135] = '\0';
        pcVar6[0x136] = '\0';
        pcVar6[0x137] = '\0';
        pcVar6[0x138] = '\0';
        pcVar6[0x139] = '\0';
        pcVar6[0x13a] = '\0';
        pcVar6[0x13b] = '\0';
        pcVar6[0x13c] = '\0';
        pcVar6[0x13d] = '\0';
        pcVar6[0x13e] = '\0';
        pcVar6[0x13f] = '\0';
        pcVar6[0xc0] = '\0';
        pcVar6[0xc1] = '\0';
        pcVar6[0xc2] = '\0';
        pcVar6[0xc3] = '\0';
        pcVar6[0xc4] = '\0';
        pcVar6[0xc5] = '\0';
        pcVar6[0xc6] = '\0';
        pcVar6[199] = '\0';
        pcVar6[200] = '\0';
        pcVar6[0xc9] = '\0';
        pcVar6[0xca] = '\0';
        pcVar6[0xcb] = '\0';
        pcVar6[0xcc] = '\0';
        pcVar6[0xcd] = '\0';
        pcVar6[0xce] = '\0';
        pcVar6[0xcf] = '\0';
        pcVar6[0xd0] = '\0';
        pcVar6[0xd1] = '\0';
        pcVar6[0xd2] = '\0';
        pcVar6[0xd3] = '\0';
        pcVar6[0xd4] = '\0';
        pcVar6[0xd5] = '\0';
        pcVar6[0xd6] = '\0';
        pcVar6[0xd7] = '\0';
        pcVar6[0xd8] = '\0';
        pcVar6[0xd9] = '\0';
        pcVar6[0xda] = '\0';
        pcVar6[0xdb] = '\0';
        pcVar6[0xdc] = '\0';
        pcVar6[0xdd] = '\0';
        pcVar6[0xde] = '\0';
        pcVar6[0xdf] = '\0';
        pcVar6[0xe0] = '\0';
        pcVar6[0xe1] = '\0';
        pcVar6[0xe2] = '\0';
        pcVar6[0xe3] = '\0';
        pcVar6[0xe4] = '\0';
        pcVar6[0xe5] = '\0';
        pcVar6[0xe6] = '\0';
        pcVar6[0xe7] = '\0';
        pcVar6[0xe8] = '\0';
        pcVar6[0xe9] = '\0';
        pcVar6[0xea] = '\0';
        pcVar6[0xeb] = '\0';
        pcVar6[0xec] = '\0';
        pcVar6[0xed] = '\0';
        pcVar6[0xee] = '\0';
        pcVar6[0xef] = '\0';
        pcVar6[0xf0] = '\0';
        pcVar6[0xf1] = '\0';
        pcVar6[0xf2] = '\0';
        pcVar6[0xf3] = '\0';
        pcVar6[0xf4] = '\0';
        pcVar6[0xf5] = '\0';
        pcVar6[0xf6] = '\0';
        pcVar6[0xf7] = '\0';
        pcVar6[0xf8] = '\0';
        pcVar6[0xf9] = '\0';
        pcVar6[0xfa] = '\0';
        pcVar6[0xfb] = '\0';
        pcVar6[0xfc] = '\0';
        pcVar6[0xfd] = '\0';
        pcVar6[0xfe] = '\0';
        pcVar6[0xff] = '\0';
        pcVar6[0x80] = '\0';
        pcVar6[0x81] = '\0';
        pcVar6[0x82] = '\0';
        pcVar6[0x83] = '\0';
        pcVar6[0x84] = '\0';
        pcVar6[0x85] = '\0';
        pcVar6[0x86] = '\0';
        pcVar6[0x87] = '\0';
        pcVar6[0x88] = '\0';
        pcVar6[0x89] = '\0';
        pcVar6[0x8a] = '\0';
        pcVar6[0x8b] = '\0';
        pcVar6[0x8c] = '\0';
        pcVar6[0x8d] = '\0';
        pcVar6[0x8e] = '\0';
        pcVar6[0x8f] = '\0';
        pcVar6[0x90] = '\0';
        pcVar6[0x91] = '\0';
        pcVar6[0x92] = '\0';
        pcVar6[0x93] = '\0';
        pcVar6[0x94] = '\0';
        pcVar6[0x95] = '\0';
        pcVar6[0x96] = '\0';
        pcVar6[0x97] = '\0';
        pcVar6[0x98] = '\0';
        pcVar6[0x99] = '\0';
        pcVar6[0x9a] = '\0';
        pcVar6[0x9b] = '\0';
        pcVar6[0x9c] = '\0';
        pcVar6[0x9d] = '\0';
        pcVar6[0x9e] = '\0';
        pcVar6[0x9f] = '\0';
        pcVar6[0xa0] = '\0';
        pcVar6[0xa1] = '\0';
        pcVar6[0xa2] = '\0';
        pcVar6[0xa3] = '\0';
        pcVar6[0xa4] = '\0';
        pcVar6[0xa5] = '\0';
        pcVar6[0xa6] = '\0';
        pcVar6[0xa7] = '\0';
        pcVar6[0xa8] = '\0';
        pcVar6[0xa9] = '\0';
        pcVar6[0xaa] = '\0';
        pcVar6[0xab] = '\0';
        pcVar6[0xac] = '\0';
        pcVar6[0xad] = '\0';
        pcVar6[0xae] = '\0';
        pcVar6[0xaf] = '\0';
        pcVar6[0xb0] = '\0';
        pcVar6[0xb1] = '\0';
        pcVar6[0xb2] = '\0';
        pcVar6[0xb3] = '\0';
        pcVar6[0xb4] = '\0';
        pcVar6[0xb5] = '\0';
        pcVar6[0xb6] = '\0';
        pcVar6[0xb7] = '\0';
        pcVar6[0xb8] = '\0';
        pcVar6[0xb9] = '\0';
        pcVar6[0xba] = '\0';
        pcVar6[0xbb] = '\0';
        pcVar6[0xbc] = '\0';
        pcVar6[0xbd] = '\0';
        pcVar6[0xbe] = '\0';
        pcVar6[0xbf] = '\0';
        pcVar6[0x40] = '\0';
        pcVar6[0x41] = '\0';
        pcVar6[0x42] = '\0';
        pcVar6[0x43] = '\0';
        pcVar6[0x44] = '\0';
        pcVar6[0x45] = '\0';
        pcVar6[0x46] = '\0';
        pcVar6[0x47] = '\0';
        pcVar6[0x48] = '\0';
        pcVar6[0x49] = '\0';
        pcVar6[0x4a] = '\0';
        pcVar6[0x4b] = '\0';
        pcVar6[0x4c] = '\0';
        pcVar6[0x4d] = '\0';
        pcVar6[0x4e] = '\0';
        pcVar6[0x4f] = '\0';
        pcVar6[0x50] = '\0';
        pcVar6[0x51] = '\0';
        pcVar6[0x52] = '\0';
        pcVar6[0x53] = '\0';
        pcVar6[0x54] = '\0';
        pcVar6[0x55] = '\0';
        pcVar6[0x56] = '\0';
        pcVar6[0x57] = '\0';
        pcVar6[0x58] = '\0';
        pcVar6[0x59] = '\0';
        pcVar6[0x5a] = '\0';
        pcVar6[0x5b] = '\0';
        pcVar6[0x5c] = '\0';
        pcVar6[0x5d] = '\0';
        pcVar6[0x5e] = '\0';
        pcVar6[0x5f] = '\0';
        pcVar6[0x60] = '\0';
        pcVar6[0x61] = '\0';
        pcVar6[0x62] = '\0';
        pcVar6[99] = '\0';
        pcVar6[100] = '\0';
        pcVar6[0x65] = '\0';
        pcVar6[0x66] = '\0';
        pcVar6[0x67] = '\0';
        pcVar6[0x68] = '\0';
        pcVar6[0x69] = '\0';
        pcVar6[0x6a] = '\0';
        pcVar6[0x6b] = '\0';
        pcVar6[0x6c] = '\0';
        pcVar6[0x6d] = '\0';
        pcVar6[0x6e] = '\0';
        pcVar6[0x6f] = '\0';
        pcVar6[0x70] = '\0';
        pcVar6[0x71] = '\0';
        pcVar6[0x72] = '\0';
        pcVar6[0x73] = '\0';
        pcVar6[0x74] = '\0';
        pcVar6[0x75] = '\0';
        pcVar6[0x76] = '\0';
        pcVar6[0x77] = '\0';
        pcVar6[0x78] = '\0';
        pcVar6[0x79] = '\0';
        pcVar6[0x7a] = '\0';
        pcVar6[0x7b] = '\0';
        pcVar6[0x7c] = '\0';
        pcVar6[0x7d] = '\0';
        pcVar6[0x7e] = '\0';
        pcVar6[0x7f] = '\0';
        pcVar6[0] = '\0';
        pcVar6[1] = '\0';
        pcVar6[2] = '\0';
        pcVar6[3] = '\0';
        pcVar6[4] = '\0';
        pcVar6[5] = '\0';
        pcVar6[6] = '\0';
        pcVar6[7] = '\0';
        pcVar6[8] = '\0';
        pcVar6[9] = '\0';
        pcVar6[10] = '\0';
        pcVar6[0xb] = '\0';
        pcVar6[0xc] = '\0';
        pcVar6[0xd] = '\0';
        pcVar6[0xe] = '\0';
        pcVar6[0xf] = '\0';
        pcVar6[0x10] = '\0';
        pcVar6[0x11] = '\0';
        pcVar6[0x12] = '\0';
        pcVar6[0x13] = '\0';
        pcVar6[0x14] = '\0';
        pcVar6[0x15] = '\0';
        pcVar6[0x16] = '\0';
        pcVar6[0x17] = '\0';
        pcVar6[0x18] = '\0';
        pcVar6[0x19] = '\0';
        pcVar6[0x1a] = '\0';
        pcVar6[0x1b] = '\0';
        pcVar6[0x1c] = '\0';
        pcVar6[0x1d] = '\0';
        pcVar6[0x1e] = '\0';
        pcVar6[0x1f] = '\0';
        pcVar6[0x20] = '\0';
        pcVar6[0x21] = '\0';
        pcVar6[0x22] = '\0';
        pcVar6[0x23] = '\0';
        pcVar6[0x24] = '\0';
        pcVar6[0x25] = '\0';
        pcVar6[0x26] = '\0';
        pcVar6[0x27] = '\0';
        pcVar6[0x28] = '\0';
        pcVar6[0x29] = '\0';
        pcVar6[0x2a] = '\0';
        pcVar6[0x2b] = '\0';
        pcVar6[0x2c] = '\0';
        pcVar6[0x2d] = '\0';
        pcVar6[0x2e] = '\0';
        pcVar6[0x2f] = '\0';
        pcVar6[0x30] = '\0';
        pcVar6[0x31] = '\0';
        pcVar6[0x32] = '\0';
        pcVar6[0x33] = '\0';
        pcVar6[0x34] = '\0';
        pcVar6[0x35] = '\0';
        pcVar6[0x36] = '\0';
        pcVar6[0x37] = '\0';
        pcVar6[0x38] = '\0';
        pcVar6[0x39] = '\0';
        pcVar6[0x3a] = '\0';
        pcVar6[0x3b] = '\0';
        pcVar6[0x3c] = '\0';
        pcVar6[0x3d] = '\0';
        pcVar6[0x3e] = '\0';
        pcVar6[0x3f] = '\0';
        __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&buildEngineGui()::buffFile,
                     &__dso_handle);
        __cxa_guard_release(&buildEngineGui()::buffFile);
      }
      ImGui::InputText("File name",
                       buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x200,0,(ImGuiInputTextCallback)0x0,
                       (void *)0x0);
      local_1d0._0_4_ = 0.0;
      local_1d0._4_4_ = 0.0;
      bVar3 = ImGui::Button("Load",(ImVec2 *)local_1d0);
      pcVar6 = buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar3) {
        IVar1 = (ImVec2)((long)local_1d0 + 0x10);
        local_1d0._0_8_ = IVar1;
        if (buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui()::buffFile.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,pcVar6,pcVar7);
        pcVar6 = buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1f0 = local_1e0;
        if (buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          pcVar7 = (pointer)0x1;
        }
        else {
          sVar5 = strlen(buildEngineGui()::buffName.super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
          pcVar7 = pcVar6 + sVar5;
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,pcVar6,pcVar7);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_1f0,local_1f0 + CONCAT44(uStack_1e4,local_1e8));
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_1d0._0_8_,(char *)(local_1d0._8_8_ + local_1d0._0_8_))
        ;
        polyscope::loadColorMap(&local_110,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0);
        }
        if ((ImVec2)local_1d0._0_8_ != IVar1) {
          operator_delete((void *)local_1d0._0_8_);
        }
      }
      ImGui::TreePop();
    }
    ImGui::TreePop();
  }
  ImGui::TreePop();
  return;
}

Assistant:

void Engine::buildEngineGui() {

  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (ImGui::TreeNode("Appearance")) {

    // == Display
    ImGui::PushItemWidth(120);
    // ImGui::Text("Background");
    // ImGui::SameLine();
    static std::string displayBackgroundName = "None";
    // if (ImGui::BeginCombo("##Background", displayBackgroundName.c_str())) {
    // if (ImGui::Selectable("None", background == BackgroundView::None)) {
    // background = BackgroundView::None;
    // ImGui::SetItemDefaultFocus();
    // displayBackgroundName = "None";
    //}
    // ImGui::EndCombo();
    //}

    ImGui::ColorEdit4("background color", (float*)&view::bgColor, ImGuiColorEditFlags_NoInputs);

    // == Transparency
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Transparency")) {

      if (ImGui::BeginCombo("Mode", modeName(transparencyMode).c_str())) {
        for (TransparencyMode m : {TransparencyMode::None, TransparencyMode::Simple, TransparencyMode::Pretty}) {
          std::string mName = modeName(m);
          if (ImGui::Selectable(mName.c_str(), transparencyMode == m)) {
            options::transparencyMode = m;
            requestRedraw();
          }
        }
        ImGui::EndCombo();
      }

      switch (transparencyMode) {
      case TransparencyMode::None: {
        ImGui::TextWrapped("Transparency effects are disabled and all related options are ignored.");
        break;
      }
      case TransparencyMode::Simple: {
        ImGui::TextWrapped(
            "Simple transparent rendering. Efficient, but objects at different depths may not look right.");
        break;
      }
      case TransparencyMode::Pretty: {
        ImGui::TextWrapped("Accurate but expensive transparent rendering. Increase the number of passes to resolve "
                           "complicated scenes.");
        if (ImGui::InputInt("Render Passes", &options::transparencyRenderPasses)) {
          requestRedraw();
        }
        break;
      }
      }

      ImGui::TreePop();
    }

    // == Ground plane
    groundPlane.buildGui();

    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Tone Mapping")) {
      ImGui::SliderFloat("exposure", &exposure, 0.1, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("white level", &whiteLevel, 0.0, 2.0, "%.3f", 2.);
      ImGui::SliderFloat("gamma", &gamma, 0.5, 3.0, "%.3f", 2.);

      ImGui::TreePop();
    }

    // == Anti-aliasing
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Anti-Aliasing")) {
      if (ImGui::InputInt("SSAA (pretty)", &ssaaFactor, 1)) {
        ssaaFactor = std::min(ssaaFactor, 4);
        ssaaFactor = std::max(ssaaFactor, 1);
        options::ssaaFactor = ssaaFactor;
        requestRedraw();
      }
      ImGui::TreePop();
    }

    // == Materials
    ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
    if (ImGui::TreeNode("Materials")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load material")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Material name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load static material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          polyscope::loadStaticMaterial(matName, filename);
        }

        if (ImGui::Button("Load blendable material")) {
          std::string filename(&buffFile[0]);
          std::string matName(&buffName[0]);
          std::string filebase, fileext;
          std::tie(filebase, fileext) = splitExt(filename);
          polyscope::loadBlendableMaterial(matName, filebase, fileext);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    // == Color maps
    if (ImGui::TreeNode("Color Maps")) {

      ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
      if (ImGui::TreeNode("Load color map")) {

        size_t buffLen = 512;
        static std::vector<char> buffName(buffLen);
        ImGui::InputText("Color map name", &buffName[0], buffLen);
        static std::vector<char> buffFile(buffLen);
        ImGui::InputText("File name", &buffFile[0], buffLen);

        if (ImGui::Button("Load")) {
          std::string filename(&buffFile[0]);
          std::string cmapName(&buffName[0]);
          polyscope::loadColorMap(cmapName, filename);
        }

        ImGui::TreePop();
      }

      ImGui::TreePop();
    }

    ImGui::TreePop();
  }
}